

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodstocsv.cpp
# Opt level: O3

void doit(void)

{
  size_t sVar1;
  Periods p;
  uint local_24;
  undefined8 local_20;
  
  puts("\"period_no\", \"weighting\"");
  sVar1 = fread(&local_24,0xc,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d, %0.9lf\n",local_20,(ulong)local_24);
      sVar1 = fread(&local_24,0xc,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit()
{
	printf("\"period_no\", \"weighting\"\n");
	
	Periods p;
	size_t i = fread(&p, sizeof(p), 1, stdin);
	while (i != 0) {
		printf("%d, %0.9lf\n",	p.period_no, p.weighting);

		i = fread(&p, sizeof(p), 1, stdin);
    }

}